

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O1

void __thiscall Fl_Pixmap::copy_data(Fl_Pixmap *this)

{
  int iVar1;
  int iVar2;
  char **ppcVar3;
  uint uVar4;
  int iVar5;
  char **ppcVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  int ncolors;
  int chars_per_pixel;
  uint local_48;
  int local_44;
  long local_40;
  char **local_38;
  
  if (this->alloc_data != 0) {
    return;
  }
  __isoc99_sscanf(*(this->super_Fl_Image).data_,"%*d%*d%d%d",&local_48,&local_44);
  uVar4 = local_48;
  uVar12 = (ulong)local_48;
  iVar1 = (this->super_Fl_Image).h_;
  if ((int)local_48 < 0) {
    iVar5 = iVar1 + 2;
    bVar13 = SBORROW4(iVar1,-2);
    iVar1 = iVar1 + 2;
  }
  else {
    iVar5 = iVar1 + local_48 + 1;
    bVar13 = SBORROW4(iVar1 + local_48,-1);
    iVar1 = iVar1 + local_48 + 1;
  }
  lVar10 = (long)local_44;
  iVar2 = (this->super_Fl_Image).w_;
  uVar9 = 0xffffffffffffffff;
  if (bVar13 == iVar1 < 0) {
    uVar9 = (long)iVar5 << 3;
  }
  ppcVar6 = (char **)operator_new__(uVar9);
  ppcVar3 = (this->super_Fl_Image).data_;
  sVar7 = strlen(*ppcVar3);
  pcVar8 = (char *)operator_new__(sVar7 + 1);
  *ppcVar6 = pcVar8;
  strcpy(pcVar8,*ppcVar3);
  local_38 = ppcVar6;
  if ((int)uVar4 < 0) {
    local_48 = -uVar4;
    pcVar8 = (char *)operator_new__((ulong)(uVar4 * -4));
    ppcVar6[1] = pcVar8;
    memcpy(pcVar8,ppcVar3[1],(ulong)(uVar4 * -4));
    local_48 = 1;
    ppcVar6 = ppcVar6 + 2;
  }
  else {
    ppcVar6 = ppcVar6 + 1;
    if (uVar12 != 0) {
      lVar11 = 0;
      local_40 = lVar10;
      do {
        sVar7 = strlen(*(char **)((long)ppcVar3 + lVar11 + 8));
        pcVar8 = (char *)operator_new__(sVar7 + 1);
        *(char **)((long)ppcVar6 + lVar11) = pcVar8;
        strcpy(pcVar8,*(char **)((long)ppcVar3 + lVar11 + 8));
        lVar11 = lVar11 + 8;
      } while (uVar12 << 3 != lVar11);
      ppcVar6 = (char **)((long)ppcVar6 + lVar11);
      lVar10 = local_40;
    }
  }
  iVar1 = (this->super_Fl_Image).h_;
  if (0 < (long)iVar1) {
    uVar12 = iVar2 * lVar10 + 1;
    lVar10 = (long)(int)local_48;
    lVar11 = 0;
    do {
      pcVar8 = (char *)operator_new__(uVar12);
      ppcVar6[lVar11] = pcVar8;
      memcpy(pcVar8,ppcVar3[lVar10 + lVar11 + 1],uVar12);
      lVar11 = lVar11 + 1;
    } while (iVar1 != lVar11);
  }
  (this->super_Fl_Image).data_ = local_38;
  (this->super_Fl_Image).count_ = local_48 + iVar1 + 1;
  this->alloc_data = 1;
  return;
}

Assistant:

void Fl_Pixmap::copy_data() {
  if (alloc_data) return;

  char		**new_data,	// New data array
		**new_row;	// Current row in image
  int		i,		// Looping var
		ncolors,	// Number of colors in image
		chars_per_pixel,// Characters per color
		chars_per_line;	// Characters per line

  // Figure out how many colors there are, and how big they are...
  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);
  chars_per_line = chars_per_pixel * w() + 1;

  // Allocate memory for the new array...
  if (ncolors < 0) new_data = new char *[h() + 2];
  else new_data = new char *[h() + ncolors + 1];

  new_data[0] = new char[strlen(data()[0]) + 1];
  strcpy(new_data[0], data()[0]);

  // Copy colors...
  if (ncolors < 0) {
    // Copy FLTK colormap values...
    ncolors = -ncolors;
    new_row = new_data + 1;
    *new_row = new char[ncolors * 4];
    memcpy(*new_row, data()[1], ncolors * 4);
    ncolors = 1;
    new_row ++;
  } else {
    // Copy standard XPM colormap values...
    for (i = 0, new_row = new_data + 1; i < ncolors; i ++, new_row ++) {
      *new_row = new char[strlen(data()[i + 1]) + 1];
      strcpy(*new_row, data()[i + 1]);
    }
  }

  // Copy image data...
  for (i = 0; i < h(); i ++, new_row ++) {
    *new_row = new char[chars_per_line];
    memcpy(*new_row, data()[i + ncolors + 1], chars_per_line);
  }

  // Update pointers...
  data((const char **)new_data, h() + ncolors + 1);
  alloc_data = 1;
}